

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O2

void __thiscall IZDeflate::lm_init(IZDeflate *this,int pack_level,ush *a_flags)

{
  ushort uVar1;
  uint uVar2;
  
  if (pack_level - 10U < 0xfffffff7) {
    error("bad pack level");
  }
  this->sliding = 0;
  if (this->window_size == 0) {
    this->sliding = 1;
    this->window_size = 0x10000;
  }
  memset(this->head,0,0x10000);
  this->max_lazy_match = (uint)this->configuration_table[pack_level].max_lazy;
  this->good_match = (uint)this->configuration_table[pack_level].good_length;
  this->nice_match = (uint)this->configuration_table[pack_level].nice_length;
  this->max_chain_length = (uint)this->configuration_table[pack_level].max_chain;
  uVar1 = 4;
  if ((pack_level < 3) || (uVar1 = 2, 7 < (uint)pack_level)) {
    *a_flags = *a_flags | uVar1;
  }
  this->strstart = 0;
  this->block_start = 0;
  uVar2 = (*this->read_buf)(this->read_handle,(char *)this->window,0x10000);
  this->lookahead = uVar2;
  if (uVar2 + 1 < 2) {
    this->eofile = 1;
    this->lookahead = 0;
  }
  else {
    this->eofile = 0;
    if (uVar2 < 0x106) {
      fill_window(this);
    }
    this->ins_h = (uint)this->window[1] ^ (uint)this->window[0] << 5;
  }
  return;
}

Assistant:

void IZDeflate::lm_init (int pack_level, ush *a_flags)
    //int pack_level; /* 0: store, 1: best speed, 9: best compression */
    //ush *flags;     /* general purpose bit flag */
{
    unsigned j;

    if (pack_level < 1 || pack_level > 9) error("bad pack level");

    /* Do not slide the window if the whole input is already in memory
     * (window_size > 0)
     */
    sliding = 0;
    if (window_size == 0L) {
        sliding = 1;
        window_size = (ulg)2L * WSIZE;
    }

    /* Use dynamic allocation if compiler does not like big static arrays: */
#    ifdef DYN_ALLOC
    if (window == NULL) {
        window = (uch*)zcalloc(WSIZE, 2 * sizeof(uch));
        if (window == NULL) ziperr(ZE_MEM, "window allocation");
    }
    if (prev == NULL) {
        prev = (Pos*)zcalloc(WSIZE, sizeof(Pos));
        head = (Pos*)zcalloc(HASH_SIZE, sizeof(Pos));
        if (prev == NULL || head == NULL) {
            ziperr(ZE_MEM, "hash table allocation");
        }
    }
#    endif /* DYN_ALLOC */

    /* Initialize the hash table (avoiding 64K overflow for 16 bit systems).
     * prev[] will be initialized on the fly.
     */
    head[HASH_SIZE - 1] = NIL;
    memset((char*)head, NIL, (unsigned)(HASH_SIZE - 1) * sizeof(*head));

    /* Set the default configuration parameters:
     */
    max_lazy_match = configuration_table[pack_level].max_lazy;
    good_match = configuration_table[pack_level].good_length;
#    ifndef FULL_SEARCH
    nice_match = configuration_table[pack_level].nice_length;
#    endif
    max_chain_length = configuration_table[pack_level].max_chain;
    if (pack_level <= 2) {
       *a_flags |= FAST;
    } else if (pack_level >= 8) {
       *a_flags |= SLOW;
    }
    /* ??? reduce max_chain_length for binary files */

    strstart = 0;
    block_start = 0L;
#    if defined(ASMV) && !defined(RISCOS)
    match_init(); /* initialize the asm code */
#    endif

    j = WSIZE;
#    ifndef MAXSEG_64K
    if (sizeof(int) > 2) j <<= 1; /* Can read 64K in one step */
#    endif
    lookahead = (*read_buf)(read_handle, (char*)window, j);

    if (lookahead == 0 || lookahead == (unsigned)EOF) {
        eofile = 1, lookahead = 0;
        return;
    }
    eofile = 0;
    /* Make sure that we always have enough lookahead. This is important
     * if input comes from a device such as a tty.
     */
    if (lookahead < MIN_LOOKAHEAD) fill_window();

    ins_h = 0;
    for (j = 0; j < MIN_MATCH - 1; j++)
        UPDATE_HASH(ins_h, window[j]);
    /* If lookahead < MIN_MATCH, ins_h is garbage, but this is
     * not important since only literal bytes will be emitted.
     */
}